

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O2

void Eigen::internal::
     dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<bool,_-1,_1,_0,_-1,_1>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<bool>,_Eigen::Matrix<bool,_-1,_1,_0,_-1,_1>_>_>,_Eigen::internal::assign_op<bool,_bool>,_0>,_1,_0>
     ::run(generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<bool,__1,_1,_0,__1,_1>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<bool>,_Eigen::Matrix<bool,__1,_1,_0,__1,_1>_>_>,_Eigen::internal::assign_op<bool,_bool>,_0>
           *kernel)

{
  DstEvaluatorType *pDVar1;
  SrcEvaluatorType *pSVar2;
  long lVar3;
  long lVar4;
  
  lVar3 = (kernel->m_dstExpr->super_PlainObjectBase<Eigen::Matrix<bool,__1,_1,_0,__1,_1>_>).
          m_storage.m_rows;
  pDVar1 = kernel->m_dst;
  pSVar2 = kernel->m_src;
  lVar4 = 0;
  if (lVar3 < 1) {
    lVar3 = lVar4;
  }
  for (; lVar3 != lVar4; lVar4 = lVar4 + 1) {
    (pDVar1->super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<bool,__1,_1,_0,__1,_1>_>_>).m_data
    [lVar4] = (pSVar2->m_functor).m_other;
  }
  return;
}

Assistant:

EIGEN_DEVICE_FUNC Index rows() const        { return m_dstExpr.rows(); }